

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::B3DImporter::ReadMESH(B3DImporter *this)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer puVar3;
  bool bVar4;
  string t;
  
  ReadInt(this);
  pVVar1 = (this->_vertices).
           super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar2 = (this->_vertices).
           super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish[-1] != this->_pos) {
    ReadChunk_abi_cxx11_(&t,this);
    bVar4 = std::operator==(&t,"VRTS");
    if (bVar4) {
      ReadVRTS(this);
    }
    else {
      bVar4 = std::operator==(&t,"TRIS");
      if (bVar4) {
        ReadTRIS(this,(int)(((long)pVVar1 - (long)pVVar2) / 0x38));
      }
    }
    puVar3 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this->_pos = puVar3[-1];
    (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3 + -1;
    std::__cxx11::string::~string((string *)&t);
  }
  return;
}

Assistant:

void B3DImporter::ReadMESH(){
    /*int matid=*/ReadInt();

    int v0= static_cast<int>(_vertices.size());

    while( ChunkSize() ){
        string t=ReadChunk();
        if( t=="VRTS" ){
            ReadVRTS();
        }else if( t=="TRIS" ){
            ReadTRIS( v0 );
        }
        ExitChunk();
    }
}